

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O3

Int __thiscall ipx::Basis::Load(Basis *this,int *basic_status)

{
  int iVar1;
  Int IVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  size_type __n;
  vector<int,_std::allocator<int>_> basis;
  vector<int,_std::allocator<int>_> map2basis;
  int local_6c;
  void *local_68;
  iterator iStack_60;
  int *local_58;
  vector<int,_std::allocator<int>_> local_48;
  
  iVar1 = this->model_->num_rows_;
  local_68 = (void *)0x0;
  iStack_60._M_current = (int *)0x0;
  local_58 = (int *)0x0;
  __n = (long)this->model_->num_cols_ + (long)iVar1;
  std::vector<int,_std::allocator<int>_>::vector(&local_48,__n,(allocator_type *)&local_6c);
  local_6c = 0;
  iVar4 = 0;
  iVar5 = (int)__n;
  if (0 < iVar5) {
    do {
      lVar3 = (long)local_6c;
      switch(basic_status[lVar3]) {
      case 0:
        if (iStack_60._M_current == local_58) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_68,iStack_60,&local_6c);
        }
        else {
          *iStack_60._M_current = local_6c;
          iStack_60._M_current = iStack_60._M_current + 1;
        }
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[local_6c] = iVar4;
        iVar4 = iVar4 + 1;
        break;
      case 1:
        if (iStack_60._M_current == local_58) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_68,iStack_60,&local_6c);
        }
        else {
          *iStack_60._M_current = local_6c;
          iStack_60._M_current = iStack_60._M_current + 1;
        }
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[local_6c] = iVar4 + iVar1;
        iVar4 = iVar4 + 1;
        break;
      case -2:
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar3] = -2;
        break;
      case -1:
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar3] = -1;
        break;
      default:
        IVar2 = 0x6b;
        goto LAB_0038d7be;
      }
      local_6c = local_6c + 1;
    } while (local_6c < iVar5);
  }
  IVar2 = 0x6b;
  if (iVar4 == iVar1) {
    if ((long)iStack_60._M_current - (long)local_68 != 0) {
      memmove((this->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start,local_68,(long)iStack_60._M_current - (long)local_68)
      ;
    }
    if ((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish -
        (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != 0) {
      memmove((this->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start,
              local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start,
              (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
    }
    IVar2 = Factorize(this);
  }
LAB_0038d7be:
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_68 != (void *)0x0) {
    operator_delete(local_68);
  }
  return IVar2;
}

Assistant:

Int Basis::Load(const int* basic_status) {
    const Int m = model_.rows();
    const Int n = model_.cols();

    // Change member variables only when basis is valid.
    std::vector<Int> basis, map2basis(n+m);
    Int p = 0;
    for (Int j = 0; j < n+m; j++) {
        switch (basic_status[j]) {
        case NONBASIC_FIXED:
            map2basis[j] = -2;
            break;
        case NONBASIC:
            map2basis[j] = -1;
            break;
        case BASIC:
            basis.push_back(j);
            map2basis[j] = p++;
            break;
        case BASIC_FREE:
            basis.push_back(j);
            map2basis[j] = p++ + m;
            break;
        default:
            return IPX_ERROR_invalid_basis;
        }
    }
    if (p != m)
        return IPX_ERROR_invalid_basis;

    std::copy(basis.begin(), basis.end(), basis_.begin());
    std::copy(map2basis.begin(), map2basis.end(), map2basis_.begin());
    return Factorize();
}